

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_dp.c
# Opt level: O3

int dynamicSeek(gdIOCtx *ctx,int pos)

{
  dynamicPtr *dp;
  int iVar1;
  
  if (pos < 0) {
    return 0;
  }
  dp = (dynamicPtr *)ctx[1].getC;
  if (dp->dataGood == 0) {
    return 0;
  }
  if (dp->realSize < pos) {
    if (dp->freeOK == 0) {
      return 0;
    }
    iVar1 = overflow2(dp->realSize,2);
    if (iVar1 != 0) {
      return 0;
    }
    iVar1 = gdReallocDynamic(dp,dp->realSize * 2);
    if (iVar1 == 0) {
      dp->dataGood = 0;
      return 0;
    }
  }
  if (dp->logicalSize < pos) {
    dp->logicalSize = pos;
  }
  dp->pos = pos;
  return 1;
}

Assistant:

static int dynamicSeek(struct gdIOCtx *ctx, const int pos)
{
	int bytesNeeded;
	dynamicPtr *dp;
	dpIOCtx *dctx;

	if (pos < 0) {
		return FALSE;
	}
	dctx = (dpIOCtx *)ctx;
	dp = dctx->dp;

	if(!dp->dataGood) {
		return FALSE;
	}

	bytesNeeded = pos;
	if(bytesNeeded > dp->realSize) {
		/* 2.0.21 */
		if(!dp->freeOK) {
			return FALSE;
		}

		if(overflow2(dp->realSize, 2)) {
			return FALSE;
		}

		if(!gdReallocDynamic(dp, dp->realSize * 2)) {
			dp->dataGood = FALSE;
			return FALSE;
		}
	}

	/* if we get here, we can be sure that we have enough bytes
	 * to copy safely */

	/* Extend the logical size if we seek beyond EOF. */
	if(pos > dp->logicalSize) {
		dp->logicalSize = pos;
	};

	dp->pos = pos;

	return TRUE;
}